

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  bool bVar1;
  pointer this_00;
  reference this_01;
  cmSourceGroup *pcVar2;
  cmSourceGroup *result;
  cmSourceGroup *group;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__range1;
  string *name_local;
  cmSourceGroup *this_local;
  
  bVar1 = MatchesFiles(this,name);
  this_local = this;
  if (!bVar1) {
    this_00 = std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
              ::operator->(&this->Internal);
    __end1 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                       (&this_00->GroupChildren);
    group = (cmSourceGroup *)
            std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(&this_00->GroupChildren)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                       *)&group), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                ::operator*(&__end1);
      pcVar2 = MatchChildrenFiles(this_01,name);
      if (pcVar2 != (cmSourceGroup *)0x0) {
        return pcVar2;
      }
      __gnu_cxx::
      __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
      ::operator++(&__end1);
    }
    this_local = (cmSourceGroup *)0x0;
  }
  return this_local;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenFiles(const std::string& name)
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}